

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O0

mk_plugin * mk_plugin_cap(char cap,mk_server *server)

{
  mk_list *__mptr;
  mk_plugin *plugin;
  mk_list *head;
  mk_server *server_local;
  char cap_local;
  
  plugin = (mk_plugin *)(server->plugins).next;
  while( true ) {
    if (plugin == (mk_plugin *)&server->plugins) {
      return (mk_plugin *)0x0;
    }
    if ((*(byte *)((long)&plugin[-1].network + 4) & cap) != 0) break;
    plugin = (mk_plugin *)plugin->shortname;
  }
  return (mk_plugin *)&plugin[-1].init_plugin;
}

Assistant:

struct mk_plugin *mk_plugin_cap(char cap, struct mk_server *server)
{
    struct mk_list *head;
    struct mk_plugin *plugin;

    mk_list_foreach(head, &server->plugins) {
        plugin = mk_list_entry(head, struct mk_plugin, _head);
        if (plugin->capabilities & cap) {
            return plugin;
        }
    }

    return NULL;
}